

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metropolis.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  time_t tVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_38;
  
  iVar4 = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  dVar5 = 1.0;
  local_38 = 0.0;
  iVar3 = 100;
  do {
    iVar1 = rand();
    dVar7 = ((double)iVar1 / 2147483647.0 + -0.5) * 0.5;
    dVar7 = dVar7 + dVar7 + local_38;
    iVar1 = rand();
    dVar6 = exp(dVar7 * -0.5 * dVar7 + local_38 * 0.5 * local_38);
    if (dVar6 <= (double)iVar1 / 2147483647.0) {
      dVar7 = local_38;
    }
    local_38 = dVar7;
    iVar4 = iVar4 + (uint)((double)iVar1 / 2147483647.0 < dVar6);
    printf("%.10f\t%f\n",local_38,(double)iVar4 / dVar5);
    dVar5 = dVar5 + 1.0;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return 0;
}

Assistant:

int main(void) {
    int niter = 100; // サンプルの数
    double step_size = 0.5e0;
    srand((unsigned) time(nullptr));

    double x = 0e0;
    int naccept = 0; // 受理回数カウンター

    for (int iter = 1; iter < niter + 1; iter++) {
        double backup_x = x;
        double action_init = 0.5e0 * x * x;

        double dx = (double) rand() / RAND_MAX;
        dx = (dx - 0.5e0) * step_size * 2e0;
        x += dx;

        double action_fin = 0.5e0 * x * x;

        // メトロポリステスト
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(action_init - action_fin) > metropolis) {
            // 受理
            naccept++;
        } else {
            // 棄却して元に戻す
            x = backup_x;
        }
        printf("%.10f\t%f\n", x, (double) naccept / iter);
    }
}